

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

void clean_mob_class(MOB_INDEX_DATA *pMob,int class_index)

{
  int in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((in_ESI == 1) || (in_ESI == 0)) {
    *(undefined2 *)(in_RDI + 0x220) = 0;
    *(undefined2 *)(in_RDI + 0x222) = 0;
  }
  if ((in_ESI == 0xb) || (in_ESI == 0)) {
    zero_vector((long *)(in_RDI + 0x210));
  }
  mob_index_data::SetClass
            ((mob_index_data *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec)
  ;
  return;
}

Assistant:

void clean_mob_class(MOB_INDEX_DATA *pMob, int class_index)
{
	if (class_index == CLASS_WARRIOR || class_index == CLASS_NONE)
	{
		pMob->ele_major = 0;
		pMob->ele_para = 0;
	}

	if (class_index == CLASS_SORCERER || class_index == CLASS_NONE)
	{
		zero_vector(pMob->styles);
	}

	pMob->SetClass(class_index);
}